

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O0

void __thiscall DebugStream::~DebugStream(DebugStream *this)

{
  DebugStream *this_local;
  
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::mutex::unlock(&s_debugSection);
  return;
}

Assistant:

~DebugStream()
    {
#if COLOR_DEBUG
        std::cout << "\033[0m" << std::endl;
#else
        std::cout << std::endl;
#endif
        s_debugSection.unlock();
    }